

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  basic_fp<unsigned___int128> value_00;
  uint64_t divisor;
  size_t sVar3;
  char cVar4;
  bool bVar5;
  result rVar6;
  round_direction rVar7;
  decimal_fp<float> dVar8;
  byte bVar9;
  byte bVar10;
  undefined8 extraout_RDX;
  long lVar11;
  size_t count;
  ulong uVar12;
  ulong uVar13;
  uint64_t error;
  uint uVar14;
  uint uVar15;
  int num_digits;
  ulong uVar16;
  uint uVar17;
  ulong uVar19;
  uint64_t *puVar20;
  ulong uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  basic_fp<unsigned_long_long> bVar24;
  fp fVar25;
  decimal_fp<double> dVar26;
  ulong uStackY_d0;
  uint local_9c;
  gen_digits_handler handler;
  undefined8 uStack_80;
  int cached_exp10;
  double local_50;
  uint64_t local_48;
  basic_fp<unsigned_long_long> local_40;
  int iVar18;
  
  uVar16 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar16 == 0x200000000) {
      buffer<char>::try_resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  uVar14 = specs._4_4_;
  if (precision < 0) {
    if ((uVar14 >> 0x12 & 1) == 0) {
      dVar26 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v9::appender,_unsigned_long,_0>((appender)buf,dVar26.significand);
      return dVar26.exponent;
    }
    dVar8 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v9::appender,_unsigned_int,_0>((appender)buf,dVar8.significand);
    return dVar8.exponent;
  }
  cached_exp10 = 0;
  local_50 = value;
  basic_fp<unsigned_long_long>::assign<double,_0>(&local_40,value);
  bVar24.f = (ulong)(uint)local_40.e;
  bVar24._8_8_ = extraout_RDX;
  bVar24 = normalize<0,unsigned_long_long>((detail *)local_40.f,bVar24);
  fVar25 = get_cached_power(-0x7c - bVar24.e,&cached_exp10);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = fVar25.f;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = bVar24.f;
  uVar21 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
  cVar4 = (char)fVar25.e + (char)bVar24.e;
  bVar9 = -cVar4 - 0x40;
  handler.buf = buf->ptr_;
  bVar10 = -cVar4;
  local_48 = 1L << (bVar10 & 0x3f);
  uVar12 = uVar21 >> (bVar10 & 0x3f);
  uVar15 = (uint)uVar12 | 1;
  uVar17 = 0x1f;
  if (uVar15 != 0) {
    for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
    }
  }
  uVar13 = (uVar12 & 0xffffffff) +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar17 * 8);
  handler.exp10 = -cached_exp10;
  uVar19 = uVar13 >> 0x20;
  uVar17 = (uint)(uVar13 >> 0x20);
  handler._8_8_ = (ulong)(uint)precision << 0x20;
  handler.fixed = uVar16 == 0x200000000;
  if (uVar16 == 0x200000000) {
    adjust_precision(&handler.precision,uVar17 - cached_exp10);
    if (0 < handler.precision) goto LAB_0012da97;
    if ((long)handler._8_8_ < 0) goto LAB_0012dd7e;
    rVar7 = get_round_direction(basic_data<void>::power_of_10_64
                                [(long)(uVar13 - 0x100000000) >> 0x20] << (bVar9 & 0x3f),uVar21 / 10
                                ,10);
    if (rVar7 != unknown) {
      lVar11 = (long)handler.size;
      handler.size = handler.size + 1;
      handler.buf[lVar11] = rVar7 == up | 0x30;
      goto LAB_0012dd7e;
    }
    uVar22 = SUB84(local_50,0);
    uVar23 = (undefined4)((ulong)local_50 >> 0x20);
  }
  else {
LAB_0012da97:
    uVar13 = local_48 - 1;
    uVar21 = uVar21 & uVar13;
    puVar20 = basic_data<void>::power_of_10_64 + (int)(uVar17 - 1);
    error = 1;
    do {
      iVar18 = (int)uVar19;
      uVar17 = iVar18 - 1;
      uVar19 = (ulong)uVar17;
      switch(uVar19) {
      case 0:
        cVar4 = (char)uVar12;
        uVar12 = 0;
        goto LAB_0012db41;
      case 1:
        uStackY_d0 = 10;
        break;
      case 2:
        uStackY_d0 = 100;
        break;
      case 3:
        uStackY_d0 = 1000;
        break;
      case 4:
        uStackY_d0 = 10000;
        break;
      case 5:
        uStackY_d0 = 100000;
        break;
      case 6:
        uStackY_d0 = 1000000;
        break;
      case 7:
        uStackY_d0 = 10000000;
        break;
      case 8:
        uStackY_d0 = 100000000;
        break;
      case 9:
        uStackY_d0 = 1000000000;
        break;
      default:
        cVar4 = '\0';
        goto LAB_0012db41;
      }
      cVar4 = (char)((uVar12 & 0xffffffff) / uStackY_d0);
      uVar12 = (uVar12 & 0xffffffff) % uStackY_d0;
LAB_0012db41:
      rVar6 = gen_digits_handler::on_digit
                        (&handler,cVar4 + '0',*puVar20 << (bVar9 & 0x3f),
                         ((uVar12 & 0xffffffff) << (bVar9 & 0x3f)) + uVar21,1,true);
      divisor = local_48;
      if (rVar6 != more) goto LAB_0012dbd1;
      puVar20 = puVar20 + -1;
    } while (1 < iVar18);
    do {
      uVar12 = uVar21 * 10;
      error = error * 10;
      uVar21 = uVar12 & uVar13;
      uVar17 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar17;
      local_9c = uVar17;
      rVar6 = gen_digits_handler::on_digit
                        (&handler,(char)(uVar12 >> (bVar9 & 0x3f)) + '0',divisor,uVar21,error,false)
      ;
    } while (rVar6 == more);
LAB_0012dbd1:
    uVar22 = SUB84(local_50,0);
    uVar23 = (undefined4)((ulong)local_50 >> 0x20);
    if (rVar6 != error) {
LAB_0012dd7e:
      local_9c = uVar17 + handler.exp10;
      buffer<char>::try_resize(buf,handler._8_8_ & 0xffffffff);
      goto LAB_0012dd99;
    }
  }
  local_9c = ~cached_exp10 + handler.size + uVar17;
  iVar18 = handler.precision;
  handler.buf = (char *)0x0;
  handler.size = 0;
  handler.precision = 0;
  handler.exp10 = 0;
  if ((uVar14 >> 0x12 & 1) == 0) {
    bVar5 = basic_fp<unsigned___int128>::assign<double,_0>
                      ((basic_fp<unsigned___int128> *)&handler,(double)CONCAT44(uVar23,uVar22));
  }
  else {
    bVar5 = basic_fp<unsigned___int128>::assign<float,_0>
                      ((basic_fp<unsigned___int128> *)&handler,
                       (float)(double)CONCAT44(uVar23,uVar22));
  }
  uVar17 = bVar5 + 4;
  if (uVar16 != 0x200000000) {
    uVar17 = (uint)bVar5;
  }
  num_digits = 0x2ff;
  if (iVar18 < 0x2ff) {
    num_digits = iVar18;
  }
  value_00._20_1_ = handler.fixed;
  value_00._21_3_ = handler._21_3_;
  value_00.e = handler.exp10;
  value_00.f._8_4_ = handler.size;
  value_00.f._12_4_ = handler.precision;
  value_00.f._0_8_ = handler.buf;
  value_00._24_8_ = uStack_80;
  format_dragon(value_00,uVar17,num_digits,buf,(int *)&local_9c);
LAB_0012dd99:
  if ((uVar14 >> 0x13 & 1) == 0 && uVar16 != 0x200000000) {
    sVar3 = buf->size_;
    uVar14 = local_9c;
    do {
      local_9c = uVar14;
      count = sVar3;
      if (count == 0) break;
      sVar3 = count - 1;
      uVar14 = local_9c + 1;
    } while (buf->ptr_[count - 1] == '0');
    buffer<char>::try_resize(buf,count);
  }
  return local_9c;
}

Assistant:

FMT_CONSTEXPR20 auto format_float(Float value, int precision, float_specs specs,
                                  buffer<char>& buf) -> int {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");
  auto converted_value = convert_float(value);

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  int exp = 0;
  bool use_dragon = true;
  unsigned dragon_flags = 0;
  if (!is_fast_float<Float>()) {
    const auto inv_log2_10 = 0.3010299956639812;  // 1 / log2(10)
    using info = dragonbox::float_info<decltype(converted_value)>;
    const auto f = basic_fp<typename info::carrier_uint>(converted_value);
    // Compute exp, an approximate power of 10, such that
    //   10^(exp - 1) <= value < 10^exp or 10^exp <= value < 10^(exp + 1).
    // This is based on log10(value) == log2(value) / log2(10) and approximation
    // of log2(value) by e + num_fraction_bits idea from double-conversion.
    exp = static_cast<int>(
        std::ceil((f.e + count_digits<1>(f.f) - 1) * inv_log2_10 - 1e-10));
    dragon_flags = dragon::fixup;
  } else if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  } else {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(converted_value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = basic_fp<uint128_t>();
    bool is_predecessor_closer = specs.binary32
                                     ? f.assign(static_cast<float>(value))
                                     : f.assign(converted_value);
    if (is_predecessor_closer) dragon_flags |= dragon::predecessor_closer;
    if (fixed) dragon_flags |= dragon::fixed;
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, dragon_flags, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}